

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

int __thiscall cppcms::json::anon_unknown_9::tockenizer::next(tockenizer *this)

{
  byte bVar1;
  tockenizer *this_00;
  byte *pbVar2;
  pointer pcVar3;
  long *plVar4;
  istream *piVar5;
  bool bVar6;
  uint i;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  long *plVar10;
  long lVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  char buf [5];
  uint v;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  uint local_34;
  
  this_00 = *(tockenizer **)(this->is_ + *(long *)(*(long *)this->is_ + -0x18) + 0xe8);
switchD_001eef1d_caseD_20:
  while( true ) {
    pbVar2 = *(byte **)(this_00 + 0x10);
    if (pbVar2 < *(byte **)(this_00 + 0x18)) {
      uVar7 = (uint)*pbVar2;
      *(byte **)(this_00 + 0x10) = pbVar2 + 1;
    }
    else {
      uVar7 = (**(code **)(*(long *)this_00 + 0x50))(this_00);
    }
    if (0x1f < (int)uVar7) break;
    if ((int)uVar7 < 10) {
      if (uVar7 != 9) {
        if (uVar7 == 0xffffffff) {
          return 0xff;
        }
        return 0x100;
      }
    }
    else if (uVar7 == 10) {
      this->line = this->line + 1;
    }
    else if (uVar7 != 0xd) {
      return 0x100;
    }
  }
  if (0x5a < (int)uVar7) {
    if ((int)uVar7 < 0x6e) {
      if (uVar7 == 0x5b) {
        return 0x5b;
      }
      if (uVar7 == 0x5d) {
        return 0x5d;
      }
      if (uVar7 == 0x66) {
        bVar6 = check((tockenizer *)this->is_,"alse");
        return (uint)bVar6 * 4 + 0x100;
      }
      return 0x100;
    }
    if ((int)uVar7 < 0x7b) {
      if (uVar7 == 0x6e) {
        bVar6 = check((tockenizer *)this->is_,"ull");
        return (uint)bVar6 + (uint)bVar6 * 4 + 0x100;
      }
      if (uVar7 == 0x74) {
        bVar6 = check((tockenizer *)this->is_,"rue");
        return (uint)bVar6 + (uint)bVar6 * 2 + 0x100;
      }
      return 0x100;
    }
    if (uVar7 == 0x7b) {
      return 0x7b;
    }
    if (uVar7 == 0x7d) {
      return 0x7d;
    }
    return 0x100;
  }
  switch(uVar7) {
  case 0x20:
    goto switchD_001eef1d_caseD_20;
  default:
    goto switchD_001eef1d_caseD_21;
  case 0x22:
    if (*(ulong *)(this_00 + 8) < *(ulong *)(this_00 + 0x10)) {
      *(ulong *)(this_00 + 0x10) = *(ulong *)(this_00 + 0x10) - 1;
    }
    else {
      _GLOBAL__N_1::tockenizer::next(this_00);
    }
    pcVar3 = (this->str)._M_dataplus._M_p;
    plVar4 = *(long **)(this->is_ + *(long *)(*(long *)this->is_ + -0x18) + 0xe8);
    (this->str)._M_string_length = 0;
    *pcVar3 = '\0';
    pbVar2 = (byte *)plVar4[2];
    if (pbVar2 < (byte *)plVar4[3]) {
      uVar7 = (uint)*pbVar2;
      plVar4[2] = (long)(pbVar2 + 1);
    }
    else {
      uVar7 = (**(code **)(*plVar4 + 0x50))(plVar4);
    }
    if (uVar7 != 0x22) {
      return 0x100;
    }
    bVar6 = false;
    uVar7 = 0;
    break;
  case 0x2c:
  case 0x3a:
    return uVar7;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    if (*(ulong *)(this_00 + 8) < *(ulong *)(this_00 + 0x10)) {
      *(ulong *)(this_00 + 0x10) = *(ulong *)(this_00 + 0x10) - 1;
    }
    else {
      _GLOBAL__N_1::tockenizer::next(this_00);
    }
    std::istream::_M_extract<double>((double *)this->is_);
    return (uint)(((byte)this->is_[*(long *)(*(long *)this->is_ + -0x18) + 0x20] & 5) == 0) * 2 +
           0x100;
  case 0x2f:
    bVar6 = check((tockenizer *)this->is_,"/");
    if (!bVar6) {
      return 0x100;
    }
    do {
      pbVar2 = *(byte **)(this_00 + 0x10);
      if (pbVar2 < *(byte **)(this_00 + 0x18)) {
        uVar7 = (uint)*pbVar2;
        *(byte **)(this_00 + 0x10) = pbVar2 + 1;
      }
      else {
        uVar7 = (**(code **)(*(long *)this_00 + 0x50))(this_00);
      }
      if (uVar7 == 0xffffffff) {
        return 0xff;
      }
    } while (uVar7 != 10);
    goto switchD_001eef1d_caseD_20;
  }
LAB_001ef0b0:
  do {
    uVar8 = uVar7;
    pbVar2 = (byte *)plVar4[2];
    if (pbVar2 < (byte *)plVar4[3]) {
      uVar7 = (uint)*pbVar2;
      plVar4[2] = (long)(pbVar2 + 1);
    }
    else {
      uVar7 = (**(code **)(*plVar4 + 0x50))(plVar4);
      if (uVar7 == 0xffffffff) {
        return 0x100;
      }
    }
    if (uVar7 < 0x20) {
      return 0x100;
    }
    if ((bool)(uVar7 != 0x5c & bVar6)) {
      return 0x100;
    }
    if (uVar7 != 0x5c) {
      if (uVar7 != 0x22) goto LAB_001ef143;
      local_40._M_current = (this->str)._M_dataplus._M_p;
      e._M_current = local_40._M_current + (this->str)._M_string_length;
      do {
        if (local_40._M_current == e._M_current) {
          return 0x101;
        }
        uVar9 = utf8::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (&local_40,e,false,false);
      } while (uVar9 != 0xffffffff);
switchD_001eef1d_caseD_21:
      return 0x100;
    }
    pbVar2 = (byte *)plVar4[2];
    if (pbVar2 < (byte *)plVar4[3]) {
      uVar7 = (uint)*pbVar2;
      plVar4[2] = (long)(pbVar2 + 1);
    }
    else {
      uVar7 = (**(code **)(*plVar4 + 0x50))(plVar4);
    }
    if (uVar7 == 0xffffffff) {
      return 0x100;
    }
    if ((bool)(uVar7 != 0x75 & bVar6)) {
      return 0x100;
    }
    if ((int)uVar7 < 0x62) {
      if (((uVar7 != 0x22) && (uVar7 != 0x2f)) && (uVar7 != 0x5c)) {
        return 0x100;
      }
      goto LAB_001ef143;
    }
    switch(uVar7) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_001eef1d_caseD_21;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x75:
      piVar5 = this->is_;
      local_40._M_current = local_40._M_current & 0xffffff0000000000;
      std::ios::widen((char)*(undefined8 *)(*(long *)piVar5 + -0x18) + (char)piVar5);
      plVar10 = (long *)std::istream::get((char *)piVar5,(long)&local_40,'\x05');
      if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
        return 0x100;
      }
      lVar11 = 0;
      do {
        bVar1 = *(byte *)((long)&local_40._M_current + lVar11);
        if (9 < (byte)(bVar1 - 0x30)) {
          uVar7 = bVar1 - 0x41;
          if (0x25 < uVar7) {
            return 0x100;
          }
          if ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
            return 0x100;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      __isoc99_sscanf(&local_40,"%x",&local_34);
      uVar9 = local_34 & 0xffff;
      if (!bVar6) goto LAB_001ef293;
      if ((local_34 & 0xfc00) != 0xdc00) {
        return 0x100;
      }
      uVar9 = (local_34 & 0x3ff) + (uVar8 & 0x3ff) * 0x400 + 0x10000;
      goto LAB_001ef2ac;
    default:
      if ((uVar7 != 0x62) && (uVar7 != 0x66)) {
        return 0x100;
      }
    }
LAB_001ef143:
    std::__cxx11::string::push_back((char)this);
    uVar7 = uVar8;
  } while( true );
LAB_001ef293:
  bVar6 = true;
  uVar7 = local_34;
  if ((local_34 & 0xfc00) != 0xd800) {
LAB_001ef2ac:
    append(this,uVar9);
    bVar6 = false;
    uVar7 = uVar8;
  }
  goto LAB_001ef0b0;
}

Assistant:

int next()
			{
				std::streambuf *buf = is_.rdbuf();
				for(;;) {
					int c;
					if((c=buf->sbumpc())==-1)
						return tock_eof;
					switch(c) {
					case '[':
					case '{':
					case ':':
					case ',':
					case '}':
					case ']':
						return c;
					case ' ':
					case '\t':
					case '\r':
						break;
					case '\n':
						line++;
						break;
					case '"':
						buf->sungetc();
						if(parse_string())
							return tock_str;
						return tock_err;
					case 't':
						if(check("rue"))
							return tock_true;
						return tock_err;
					case 'n':
						if(check("ull"))
							return tock_null;
						return tock_err;
					case 'f':
						if(check("alse"))
							return tock_false;
						return tock_err;
					case '-':
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
					case '8':
					case '9':
						buf->sungetc();
						if(parse_number())
							return tock_number;
						return tock_err;
					case '/':
						if(check("/")) {
							while((c=buf->sbumpc())!=-1 && c!='\n')
								;
							if(c=='\n')
								break;
							return tock_eof;
						}
						return tock_err;
					default:
						return tock_err;
					}
				}
			}